

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_llist *list;
  byte *pbVar1;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  FILEPROTO *pFVar4;
  curl_chunk_bgn_callback p_Var5;
  void *pvVar6;
  WildcardData *pWVar7;
  curl_trc_feat *pcVar8;
  byte bVar9;
  _Bool connected;
  CURLcode CVar10;
  uint uVar11;
  undefined8 *puVar12;
  long lVar13;
  Curl_llist_node *pCVar14;
  size_t sVar15;
  char *pcVar16;
  ftp_wc *pfVar17;
  ftp_parselist_data *pfVar18;
  char *pcVar19;
  uchar uVar20;
  CURLcode local_4c;
  Curl_cwriter *ftp_lc_writer;
  connectdata *local_40;
  _Bool *local_38;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  CVar10 = Curl_cwriter_create(&ftp_lc_writer,data,&ftp_cw_lc,CURL_CW_CONTENT_DECODE);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  CVar10 = Curl_cwriter_add(data,ftp_lc_writer);
  if (CVar10 != CURLE_OK) {
    Curl_cwriter_free(data,ftp_lc_writer);
    return CVar10;
  }
  if (((data->state).field_0x7bf & 1) != 0) {
    pWVar3 = data->wildcard;
    local_40 = data->conn;
    list = &pWVar3->filelist;
    local_4c = CURLE_OUT_OF_MEMORY;
    local_38 = done;
switchD_001280f4_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_001280f4_caseD_0;
    case '\x01':
      pFVar4 = (data->req).p.file;
      pcVar19 = pFVar4->path;
      pWVar7 = data->wildcard;
      pcVar16 = strrchr(pcVar19,0x2f);
      if (pcVar16 == (char *)0x0) {
        if (*pcVar19 != '\0') {
          pcVar16 = (*Curl_cstrdup)(pcVar19);
          pWVar7->pattern = pcVar16;
          goto LAB_001283f1;
        }
LAB_001284e3:
        pWVar7->state = '\x04';
        local_4c = ftp_parse_url_path(data);
      }
      else {
        if (pcVar16[1] == '\0') goto LAB_001284e3;
        pcVar19 = pcVar16 + 1;
        pcVar16 = (*Curl_cstrdup)(pcVar19);
        pWVar7->pattern = pcVar16;
LAB_001283f1:
        if (pcVar16 == (char *)0x0) {
          local_4c = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar19 = '\0';
          pfVar17 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          if (pfVar17 == (ftp_wc *)0x0) {
            local_4c = CURLE_OUT_OF_MEMORY;
          }
          else {
            pfVar18 = Curl_ftp_parselist_data_alloc();
            pfVar17->parser = pfVar18;
            if (pfVar18 == (ftp_parselist_data *)0x0) {
              local_4c = CURLE_OUT_OF_MEMORY;
            }
            else {
              pWVar7->ftpwc = pfVar17;
              pWVar7->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              local_4c = ftp_parse_url_path(data);
              if (local_4c == CURLE_OK) {
                pcVar19 = (*Curl_cstrdup)(pFVar4->path);
                pWVar7->path = pcVar19;
                local_4c = CURLE_OUT_OF_MEMORY;
                if (pcVar19 != (char *)0x0) {
                  (pfVar17->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar17->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  local_4c = CURLE_OK;
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    local_4c = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_0012854e;
                }
              }
            }
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar17);
            (*Curl_cfree)(pfVar17);
          }
          (*Curl_cfree)(pWVar7->pattern);
          pWVar7->pattern = (char *)0x0;
          pWVar7->ftpwc = (ftp_wc *)0x0;
          pWVar7->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_0012854e:
      if (pWVar3->state != '\x04') {
        bVar9 = (local_4c != CURLE_OK) << 2 | 2;
        goto LAB_00128563;
      }
      goto LAB_00128567;
    case '\x02':
      pfVar17 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar17->backup).write_function;
      (data->set).out = (pfVar17->backup).file_descriptor;
      (pfVar17->backup).write_function = (curl_write_callback)0x0;
      (pfVar17->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar10 = Curl_ftp_parselist_geterror(pfVar17->parser);
      uVar20 = '\x04';
      if (CVar10 == CURLE_OK) {
        sVar15 = Curl_llist_count(list);
        if (sVar15 == 0) {
          pWVar3->state = '\x04';
          local_4c = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_00128567;
        }
        goto switchD_001280f4_default;
      }
      break;
    case '\x03':
      pCVar14 = Curl_llist_head(list);
      puVar12 = (undefined8 *)Curl_node_elem(pCVar14);
      pFVar4 = (data->req).p.file;
      pcVar19 = curl_maprintf("%s%s",pWVar3->path,*puVar12);
      if (pcVar19 == (char *)0x0) goto LAB_00128567;
      (*Curl_cfree)(pFVar4->freepath);
      pFVar4->path = pcVar19;
      pFVar4->freepath = pcVar19;
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        Curl_infof(data,"Wildcard - START of \"%s\"",*puVar12);
      }
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        p_Var5 = (data->set).chunk_bgn;
        pvVar6 = (data->set).wildcardptr;
        sVar15 = Curl_llist_count(list);
        lVar13 = (*p_Var5)(puVar12,pvVar6,(int)sVar15);
        Curl_set_in_callback(data,false);
        if (lVar13 == 2) {
          uVar20 = '\x05';
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) {
            Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar12);
          }
          break;
        }
        if (lVar13 == 1) {
          local_4c = CURLE_CHUNK_FAILED;
          goto LAB_00128567;
        }
      }
      uVar20 = '\x05';
      if (*(int *)(puVar12 + 1) == 0) {
        if ((*(byte *)(puVar12 + 0xc) & 0x40) != 0) {
          (local_40->proto).ftpc.known_filesize = puVar12[5];
        }
        local_4c = ftp_parse_url_path(data);
        if (local_4c == CURLE_OK) {
          pCVar14 = Curl_llist_head(list);
          Curl_node_remove(pCVar14);
          sVar15 = Curl_llist_count(list);
          local_4c = CURLE_OK;
          if (sVar15 == 0) {
            pWVar3->state = '\x04';
          }
        }
        goto LAB_00128567;
      }
      break;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        bVar9 = 7;
        local_4c = CURLE_OK;
      }
      else {
        local_4c = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
        bVar9 = local_4c == CURLE_OK | 6;
      }
LAB_00128563:
      pWVar3->state = bVar9;
      goto LAB_00128567;
    case '\x05':
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(data->set).chunk_end)((data->set).wildcardptr);
        Curl_set_in_callback(data,false);
      }
      pCVar14 = Curl_llist_head(list);
      Curl_node_remove(pCVar14);
      sVar15 = Curl_llist_count(list);
      uVar20 = (sVar15 == 0) + '\x03';
      break;
    default:
      goto switchD_001280f4_default;
    }
    pWVar3->state = uVar20;
    goto switchD_001280f4_default;
  }
  local_4c = ftp_parse_url_path(data);
joined_r0x0012858c:
  if (local_4c != CURLE_OK) {
    return local_4c;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     (((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    if (data->conn == (connectdata *)0x0) {
      pcVar19 = "???";
    }
    else {
      pcVar19 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO phase starts",pcVar19);
  }
  if (((data->req).field_0xd3 & 2) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar10 = ftp_state_quote(data,true,'\f');
  if (CVar10 == CURLE_OK) {
    CVar10 = ftp_multi_statemach(data,done);
    connected = Curl_conn_is_connected(data->conn,1);
    uVar11 = (uint)*(undefined8 *)&(data->set).field_0x89c;
    if (connected) {
      if (((uVar11 >> 0x1e & 1) != 0) &&
         ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
      {
        if (data->conn == (connectdata *)0x0) {
          pcVar19 = "???";
        }
        else {
          pcVar19 = ftp_state_names[(data->conn->proto).ftpc.state];
        }
        Curl_infof(data,"[FTP] [%s] perform, DATA connection established",pcVar19);
      }
    }
    else if ((((uVar11 >> 0x1e & 1) != 0) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar19 = "???";
      }
      else {
        pcVar19 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] perform, awaiting DATA connect",pcVar19);
    }
    if ((((*done == true) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))))
       && (0 < Curl_trc_feat_ftp.log_level)) {
      if (data->conn == (connectdata *)0x0) {
        pcVar19 = "???";
      }
      else {
        pcVar19 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] DO phase is complete1",pcVar19);
    }
    if (CVar10 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar10 = ftp_dophase_done(data,connected);
      return CVar10;
    }
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar10;
switchD_001280f4_caseD_0:
  local_4c = CURLE_OK;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_00128567:
  done = local_38;
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x0012858c;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

#ifdef CURL_PREFER_LF_LINEENDS
  {
    /* FTP data may need conversion. */
    struct Curl_cwriter *ftp_lc_writer;

    result = Curl_cwriter_create(&ftp_lc_writer, data, &ftp_cw_lc,
                                 CURL_CW_CONTENT_DECODE);
    if(result)
      return result;

    result = Curl_cwriter_add(data, ftp_lc_writer);
    if(result) {
      Curl_cwriter_free(data, ftp_lc_writer);
      return result;
    }
  }
#endif /* CURL_PREFER_LF_LINEENDS */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}